

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManSeqEquivMerge(Gia_Man_t *p,Gia_Man_t **pPart)

{
  size_t __size;
  int iVar1;
  undefined4 *__s;
  void *__s_00;
  Gia_Rpr_t *pGVar2;
  long lVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  Gia_Man_t *p_00;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  iVar1 = p->nObjs;
  __size = (long)iVar1 * 4;
  __s = (undefined4 *)malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("p->pReprs == NULL && p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x127a,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
  }
  pGVar2 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar2;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    p->pReprs[lVar3] = (Gia_Rpr_t)((uint)p->pReprs[lVar3] | 0xfffffff);
    iVar1 = p->nObjs;
  }
  *__s = 0;
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      uVar10 = p->nObjs;
      uVar8 = 0;
      uVar6 = 0;
      if (0 < (int)uVar10) {
        uVar6 = (ulong)uVar10;
      }
      for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        lVar3 = (long)(int)__s[uVar8];
        if ((lVar3 != -1) && (*(int *)((long)__s_00 + lVar3 * 4) == -1)) {
          *(int *)((long)__s_00 + lVar3 * 4) = (int)uVar8;
          __s[uVar8] = 0xffffffff;
        }
      }
      for (lVar3 = 0; lVar3 < (int)uVar10; lVar3 = lVar3 + 1) {
        if ((long)(int)__s[lVar3] != -1) {
          p->pReprs[lVar3] =
               (Gia_Rpr_t)
               ((uint)p->pReprs[lVar3] & 0xf0000000 |
               *(uint *)((long)__s_00 + (long)(int)__s[lVar3] * 4) & 0xfffffff);
          uVar10 = p->nObjs;
        }
      }
      free(__s);
      free(__s_00);
      piVar5 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar5;
      return;
    }
    p_00 = pPart[lVar3];
    if ((p_00->pReprs == (Gia_Rpr_t *)0x0) || (p_00->pNexts == (int *)0x0)) {
      __assert_fail("pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x1282,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
    }
    for (lVar11 = 0; uVar8 = (ulong)p_00->nObjs, lVar11 < (long)uVar8; lVar11 = lVar11 + 1) {
      if (((uint)p_00->pReprs[lVar11] & 0xfffffff) == 0) {
        pGVar4 = Gia_ManObj(p_00,(int)lVar11);
        __s[pGVar4->Value] = 0;
        p_00 = pPart[lVar3];
      }
    }
    for (uVar10 = 1; (int)uVar10 < (int)uVar8; uVar10 = uVar10 + 1) {
      iVar1 = Gia_ObjIsHead(p_00,uVar10);
      if (iVar1 != 0) {
        pGVar4 = Gia_ManObj(p_00,uVar10);
        uVar9 = pGVar4->Value;
        p_00 = pPart[lVar3];
        if (lVar3 == 1) {
          iVar1 = Gia_ObjIsHead(p_00,uVar10);
          uVar7 = uVar10;
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsHead(pPart[n], i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                          ,0x128b,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
          }
          for (; 0 < (int)uVar7; uVar7 = p_00->pNexts[uVar7]) {
            pGVar4 = Gia_ManObj(p_00,uVar7);
            if (__s[pGVar4->Value] != -1) {
              pGVar4 = Gia_ManObj(pPart[1],uVar7);
              uVar9 = __s[pGVar4->Value];
            }
            p_00 = pPart[1];
          }
        }
        iVar1 = Gia_ObjIsHead(p_00,uVar10);
        uVar7 = uVar10;
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsHead(pPart[n], i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0x128f,"void Gia_ManSeqEquivMerge(Gia_Man_t *, Gia_Man_t **)");
        }
        for (; 0 < (int)uVar7; uVar7 = p_00->pNexts[uVar7]) {
          pGVar4 = Gia_ManObj(p_00,uVar7);
          __s[pGVar4->Value] = uVar9;
          p_00 = pPart[lVar3];
        }
        uVar8 = (ulong)(uint)p_00->nObjs;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void Gia_ManSeqEquivMerge( Gia_Man_t * p, Gia_Man_t * pPart[2] )
{
    int i, iObj, * pClasses    = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int n, Repr, * pClass2Repr = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // initialize equiv class representation in the big AIG
    assert( p->pReprs  == NULL && p->pNexts  == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    // map equivalences of p into classes
    pClasses[0] = 0;
    for ( n = 0; n < 2; n++ )
    {
        assert( pPart[n]->pReprs != NULL && pPart[n]->pNexts != NULL );
        for ( i = 0; i < Gia_ManObjNum(pPart[n]); i++ )
            if ( Gia_ObjRepr(pPart[n], i) == 0 )
                pClasses[Gia_ManObj(pPart[n], i)->Value] = 0;
        Gia_ManForEachClass( pPart[n], i )
        {
            Repr = Gia_ManObj(pPart[n], i)->Value;
            if ( n == 1 )
            {
                Gia_ClassForEachObj( pPart[n], i, iObj )
                    if ( pClasses[Gia_ManObj(pPart[n], iObj)->Value] != -1 )
                        Repr = pClasses[Gia_ManObj(pPart[n], iObj)->Value];
            }
            Gia_ClassForEachObj( pPart[n], i, iObj )
                pClasses[Gia_ManObj(pPart[n], iObj)->Value] = Repr;
        }
    }
    // map representatives of each class
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 && pClass2Repr[pClasses[i]] == -1 )
        {
            pClass2Repr[pClasses[i]] = i;
            pClasses[i] = -1;
        }
    // remap the remaining classes
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pClasses[i] != -1 )
            p->pReprs[i].iRepr = pClass2Repr[pClasses[i]];
    ABC_FREE(pClasses);
    ABC_FREE(pClass2Repr);
    // create next pointers
    p->pNexts = Gia_ManDeriveNexts( p );
}